

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

YieldResult * __thiscall
NEST::NESTcalc::GetYieldGamma
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,double multFact)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double __y;
  double dVar4;
  Wvalue WVar5;
  YieldResult result;
  double local_48;
  double dStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  WVar5 = WorkFunction(density,this->fdetector->molarMass,this->fdetector->OldW13eV);
  dVar1 = WVar5.Wq_eV;
  dVar4 = pow(dfield / 165.34,0.72665);
  dVar2 = -30.622600000000002 / (dVar4 + 1.0) + 33.951;
  dVar4 = pow(dfield / 34.195,0.87459);
  dVar3 = -12.418999999999999 / (dVar4 + 1.0) + 23.156;
  dVar4 = pow(density,8.2076);
  dVar4 = pow(dfield / (240720.0 / dVar4),0.83344);
  if (this->fdetector->inGas == false) {
    __y = 2.0;
  }
  else {
    __y = -2.0;
  }
  dVar4 = pow(energy / (762.425 / (dVar4 + 1.0) + 66.825),__y);
  dVar4 = (0.0 - dVar3) / (dVar4 + 1.0) +
          (1000.0 / dVar1 - dVar2) / (energy * 0.5 * energy * 0.5 + 1.0) + dVar2 + dVar3;
  if (this->fdetector->OldW13eV == false) {
    dVar4 = dVar4 * 1.08;
  }
  local_28 = 0.0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = (((energy * 1000.0) / dVar1) / energy - dVar4 * multFact) * energy;
  dStack_40 = dVar4 * multFact * energy;
  (*this->_vptr_NESTcalc[0x11])(SUB84(energy,0),density,this);
  uStack_30 = 0x3ff0000000000000;
  uStack_20 = 0xc08f380000000000;
  local_28 = dfield;
  (*this->_vptr_NESTcalc[0xb])(SUB84(energy,0),dVar1,__return_storage_ptr__,this,&local_48);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldGamma(double energy, double density,
                                    double dfield, double multFact) {
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double alpha = wvalue.alpha;
  constexpr double m3 = 2., m4 = 2., m6 = 0.;

  const double m1 =
      33.951 + (3.3284 - 33.951) / (1. + pow(dfield / 165.34, .72665));
  double m2 = 1000 / Wq_eV;
  double m5 = 23.156 + (10.737 - 23.156) / (1. + pow(dfield / 34.195, .87459));
  double densCorr = 240720. / pow(density, 8.2076);
  double m7 =
      66.825 + (829.25 - 66.825) / (1. + pow(dfield / densCorr, .83344));

  double Nq = energy * 1000. / Wq_eV;
  double m8 = 2.;
  if (fdetector->get_inGas()) m8 = -2.;
  double Qy = m1 + (m2 - m1) / (1. + pow(energy / m3, m4)) + m5 +
              (m6 - m5) / (1. + pow(energy / m7, m8));
  if (!fdetector->get_OldW13eV()) Qy *= ZurichEXOQ;
  Qy *= multFact;
  double Ly = Nq / energy - Qy;

  YieldResult result{};
  result.PhotonYield = Ly * energy;
  result.ElectronYield = Qy * energy;
  result.ExcitonRatio = NexONi(energy, density);
  result.Lindhard = 1;
  result.ElectricField = dfield;
  result.DeltaT_Scint = -999;
  return YieldResultValidity(result, energy, Wq_eV);
}